

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.hpp
# Opt level: O0

void __thiscall
jsoncons::
key_value<std::__cxx11::string,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
::key_value<std::basic_string_view<char,std::char_traits<char>>const&>
          (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           *this,key_type *name,basic_string_view<char,_std::char_traits<char>_> *args)

{
  string_view_type *s;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_RDX;
  string *in_RSI;
  string *in_RDI;
  allocator<char> local_19;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *local_18;
  
  local_18 = in_RDX;
  std::__cxx11::string::string(in_RDI,in_RSI);
  s = (string_view_type *)(in_RDI + 0x20);
  std::allocator<char>::allocator();
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
            (local_18,s,(allocator_type *)in_RDI);
  std::allocator<char>::~allocator(&local_19);
  return;
}

Assistant:

key_value(key_type&& name,  Args&& ... args) 
            : key_(std::move(name)), value_(std::forward<Args>(args)...)
        {
        }